

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void ws_read_finish_msg(nni_ws *ws)

{
  size_t sVar1;
  int iVar2;
  nng_err result;
  size_t sVar3;
  void *local_40;
  uint8_t *body;
  nni_msg *pnStack_30;
  int rv;
  nni_msg *msg;
  ws_frame *frame;
  size_t len;
  nni_aio *aio;
  nni_ws *ws_local;
  
  if ((((ws->inmsg & 1U) == 0) &&
      (aio = (nni_aio *)ws, iVar2 = nni_list_empty(&ws->rxq), iVar2 == 0)) &&
     (len = (size_t)nni_list_first((nni_list *)((long)&(aio->a_task).task_cv.cv + 0x28)),
     (void *)len != (void *)0x0)) {
    frame = (ws_frame *)0x0;
    for (msg = (nni_msg *)nni_list_first((nni_list *)(aio->a_iov + 2)); msg != (nni_msg *)0x0;
        msg = (nni_msg *)nni_list_next((nni_list *)(aio->a_iov + 2),msg)) {
      frame = (ws_frame *)(frame->head + ((msg->m_addr).s_storage.sa_pad[6] - 0x10));
    }
    nni_aio_list_remove((nni_aio *)len);
    result = nni_msg_alloc(&stack0xffffffffffffffd0,(size_t)frame);
    if (result == NNG_OK) {
      local_40 = nni_msg_body(pnStack_30);
      while (msg = (nni_msg *)nni_list_first((nni_list *)(aio->a_iov + 2)), msg != (nni_msg *)0x0) {
        nni_list_remove((nni_list *)(aio->a_iov + 2),msg);
        memcpy(local_40,(void *)(msg->m_addr).s_storage.sa_pad[10],(msg->m_addr).s_storage.sa_pad[6]
              );
        local_40 = (void *)((msg->m_addr).s_storage.sa_pad[6] + (long)local_40);
        ws_frame_fini((ws_frame *)msg);
      }
      nni_aio_set_msg((nni_aio *)len,pnStack_30);
      sVar1 = len;
      sVar3 = nni_msg_len(pnStack_30);
      nni_aio_bump_count((nni_aio *)sVar1,sVar3);
      sVar1 = len;
      sVar3 = nni_msg_len(pnStack_30);
      nni_aio_finish((nni_aio *)sVar1,NNG_OK,sVar3);
    }
    else {
      nni_aio_finish_error((nni_aio *)len,result);
      ws_close_error((nni_ws *)aio,0x3f3);
    }
  }
  return;
}

Assistant:

static void
ws_read_finish_msg(nni_ws *ws)
{
	nni_aio  *aio;
	size_t    len;
	ws_frame *frame;
	nni_msg  *msg;
	int       rv;
	uint8_t  *body;

	// If we have no data, no waiter, or have not received the complete
	// message yet, then there is nothing to do.
	if (ws->inmsg || nni_list_empty(&ws->rxq) ||
	    ((aio = nni_list_first(&ws->recvq)) == NULL)) {
		return;
	}

	// At this point, we have both a complete message in the queue (and
	// there should not be any frames other than the for the message),
	// and a waiting reader.
	len = 0;
	NNI_LIST_FOREACH (&ws->rxq, frame) {
		len += frame->len;
	}

	nni_aio_list_remove(aio);

	if ((rv = nni_msg_alloc(&msg, len)) != 0) {
		nni_aio_finish_error(aio, rv);
		ws_close_error(ws, WS_CLOSE_INTERNAL);
		return;
	}
	body = nni_msg_body(msg);
	while ((frame = nni_list_first(&ws->rxq)) != NULL) {
		nni_list_remove(&ws->rxq, frame);
		memcpy(body, frame->buf, frame->len);
		body += frame->len;
		ws_frame_fini(frame);
	}

	nni_aio_set_msg(aio, msg);
	nni_aio_bump_count(aio, nni_msg_len(msg));
	nni_aio_finish(aio, 0, nni_msg_len(msg));
}